

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida.c
# Opt level: O0

void IDAFreeVectors(IDAMem IDA_mem)

{
  long in_RDI;
  int maxcol;
  int j;
  undefined4 local_14;
  undefined4 local_c;
  
  N_VDestroy(*(undefined8 *)(in_RDI + 0x180));
  *(undefined8 *)(in_RDI + 0x180) = 0;
  N_VDestroy(*(undefined8 *)(in_RDI + 0x1c8));
  *(undefined8 *)(in_RDI + 0x1c8) = 0;
  N_VDestroy(*(undefined8 *)(in_RDI + 0x1a8));
  *(undefined8 *)(in_RDI + 0x1a8) = 0;
  N_VDestroy(*(undefined8 *)(in_RDI + 0x198));
  *(undefined8 *)(in_RDI + 0x198) = 0;
  N_VDestroy(*(undefined8 *)(in_RDI + 0x1a0));
  *(undefined8 *)(in_RDI + 0x1a0) = 0;
  N_VDestroy(*(undefined8 *)(in_RDI + 0x1c0));
  *(undefined8 *)(in_RDI + 0x1c0) = 0;
  N_VDestroy(*(undefined8 *)(in_RDI + 0x1d0));
  *(undefined8 *)(in_RDI + 0x1d0) = 0;
  N_VDestroy(*(undefined8 *)(in_RDI + 0x1d8));
  *(undefined8 *)(in_RDI + 0x1d8) = 0;
  N_VDestroy(*(undefined8 *)(in_RDI + 0x1e0));
  *(undefined8 *)(in_RDI + 0x1e0) = 0;
  if (*(int *)(in_RDI + 0x30c) < 4) {
    local_14 = 3;
  }
  else {
    local_14 = *(int *)(in_RDI + 0x30c);
  }
  for (local_c = 0; local_c <= local_14; local_c = local_c + 1) {
    N_VDestroy(*(undefined8 *)(in_RDI + 0x60 + (long)local_c * 8));
    *(undefined8 *)(in_RDI + 0x60 + (long)local_c * 8) = 0;
  }
  *(long *)(in_RDI + 0x3a8) =
       *(long *)(in_RDI + 0x3a8) - (long)(local_14 + 10) * *(long *)(in_RDI + 0x398);
  *(long *)(in_RDI + 0x3b0) =
       *(long *)(in_RDI + 0x3b0) - (long)(local_14 + 10) * *(long *)(in_RDI + 0x3a0);
  if (*(int *)(in_RDI + 0x3c4) != 0) {
    N_VDestroy(*(undefined8 *)(in_RDI + 0x38));
    *(undefined8 *)(in_RDI + 0x38) = 0;
    *(long *)(in_RDI + 0x3a8) = *(long *)(in_RDI + 0x3a8) - *(long *)(in_RDI + 0x398);
    *(long *)(in_RDI + 0x3b0) = *(long *)(in_RDI + 0x3b0) - *(long *)(in_RDI + 0x3a0);
  }
  if (*(int *)(in_RDI + 0x3c8) != 0) {
    N_VDestroy(*(undefined8 *)(in_RDI + 0x1b8));
    *(undefined8 *)(in_RDI + 0x1b8) = 0;
    *(long *)(in_RDI + 0x3a8) = *(long *)(in_RDI + 0x3a8) - *(long *)(in_RDI + 0x398);
    *(long *)(in_RDI + 0x3b0) = *(long *)(in_RDI + 0x3b0) - *(long *)(in_RDI + 0x3a0);
  }
  if (*(int *)(in_RDI + 0x3cc) != 0) {
    N_VDestroy(*(undefined8 *)(in_RDI + 0x1b0));
    *(undefined8 *)(in_RDI + 0x1b0) = 0;
    *(long *)(in_RDI + 0x3a8) = *(long *)(in_RDI + 0x3a8) - *(long *)(in_RDI + 0x398);
    *(long *)(in_RDI + 0x3b0) = *(long *)(in_RDI + 0x3b0) - *(long *)(in_RDI + 0x3a0);
  }
  return;
}

Assistant:

static void IDAFreeVectors(IDAMem IDA_mem)
{
  int j, maxcol;

  N_VDestroy(IDA_mem->ida_ewt);
  IDA_mem->ida_ewt = NULL;
  N_VDestroy(IDA_mem->ida_ee);
  IDA_mem->ida_ee = NULL;
  N_VDestroy(IDA_mem->ida_delta);
  IDA_mem->ida_delta = NULL;
  N_VDestroy(IDA_mem->ida_yypredict);
  IDA_mem->ida_yypredict = NULL;
  N_VDestroy(IDA_mem->ida_yppredict);
  IDA_mem->ida_yppredict = NULL;
  N_VDestroy(IDA_mem->ida_savres);
  IDA_mem->ida_savres = NULL;
  N_VDestroy(IDA_mem->ida_tempv1);
  IDA_mem->ida_tempv1 = NULL;
  N_VDestroy(IDA_mem->ida_tempv2);
  IDA_mem->ida_tempv2 = NULL;
  N_VDestroy(IDA_mem->ida_tempv3);
  IDA_mem->ida_tempv3 = NULL;
  maxcol              = SUNMAX(IDA_mem->ida_maxord_alloc, 3);
  for (j = 0; j <= maxcol; j++)
  {
    N_VDestroy(IDA_mem->ida_phi[j]);
    IDA_mem->ida_phi[j] = NULL;
  }

  IDA_mem->ida_lrw -= (maxcol + 10) * IDA_mem->ida_lrw1;
  IDA_mem->ida_liw -= (maxcol + 10) * IDA_mem->ida_liw1;

  if (IDA_mem->ida_VatolMallocDone)
  {
    N_VDestroy(IDA_mem->ida_Vatol);
    IDA_mem->ida_Vatol = NULL;
    IDA_mem->ida_lrw -= IDA_mem->ida_lrw1;
    IDA_mem->ida_liw -= IDA_mem->ida_liw1;
  }

  if (IDA_mem->ida_constraintsMallocDone)
  {
    N_VDestroy(IDA_mem->ida_constraints);
    IDA_mem->ida_constraints = NULL;
    IDA_mem->ida_lrw -= IDA_mem->ida_lrw1;
    IDA_mem->ida_liw -= IDA_mem->ida_liw1;
  }

  if (IDA_mem->ida_idMallocDone)
  {
    N_VDestroy(IDA_mem->ida_id);
    IDA_mem->ida_id = NULL;
    IDA_mem->ida_lrw -= IDA_mem->ida_lrw1;
    IDA_mem->ida_liw -= IDA_mem->ida_liw1;
  }
}